

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  ulong uVar1;
  long lVar2;
  int argc_00;
  int iVar3;
  int in_EDX;
  undefined8 *in_R8;
  char **azArg;
  char *zModule;
  int nDequote;
  char **azDequote;
  int rc;
  sqlite3_tokenizer *pTok;
  sqlite3_tokenizer_module *pMod;
  Fts3tokTable *pTab;
  int in_stack_ffffffffffffff7c;
  char **in_stack_ffffffffffffff80;
  sqlite3_tokenizer_module **in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *zName;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char ***pazDequote;
  uint in_stack_ffffffffffffffa8;
  undefined1 local_50 [4];
  void *local_40;
  int local_4;
  
  local_40 = (void *)0x0;
  _local_50 = 0;
  pazDequote = (char ***)0x0;
  local_4 = sqlite3_declare_vtab
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90);
  lVar2 = _local_50;
  if (local_4 == 0) {
    iVar3 = in_EDX + -3;
    uVar1 = (ulong)_local_50 >> 0x20;
    argc_00 = (int)uVar1;
    _local_50 = lVar2;
    local_4 = fts3tokDequoteArray(argc_00,(char **)(ulong)in_stack_ffffffffffffffa8,pazDequote);
    if (local_4 == 0) {
      if (iVar3 < 1) {
        zName = "simple";
      }
      else {
        zName = (char *)*pazDequote;
      }
      local_4 = fts3tokQueryTokenizer
                          ((Fts3Hash *)CONCAT44(iVar3,in_stack_ffffffffffffff98),zName,
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    if (local_4 == 0) {
      if (iVar3 < 2) {
        in_stack_ffffffffffffff7c = 0;
      }
      else {
        in_stack_ffffffffffffff7c = iVar3 + -1;
      }
      local_4 = (*pcRam0000000000000008)(in_stack_ffffffffffffff7c,pazDequote + 1,local_50);
    }
    if ((local_4 == 0) &&
       (local_40 = sqlite3_malloc(in_stack_ffffffffffffff7c), local_40 == (void *)0x0)) {
      local_4 = 7;
    }
    if (local_4 == 0) {
      memset(local_40,0,0x28);
      *(undefined8 *)((long)local_40 + 0x18) = 0;
      *(long *)((long)local_40 + 0x20) = _local_50;
      *in_R8 = local_40;
    }
    else if (_local_50 != 0) {
      (*pcRam0000000000000010)(_local_50);
    }
    sqlite3_free((void *)0x1d12a7);
  }
  return local_4;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}